

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

RangeType __thiscall
soplex::SoPlexBase<double>::_switchRangeType(SoPlexBase<double> *this,RangeType *rangeType)

{
  RangeType *rangeType_local;
  SoPlexBase<double> *this_local;
  undefined4 local_4;
  
  if (*rangeType == RANGETYPE_LOWER) {
    local_4 = RANGETYPE_UPPER;
  }
  else if (*rangeType == RANGETYPE_UPPER) {
    local_4 = RANGETYPE_LOWER;
  }
  else {
    local_4 = *rangeType;
  }
  return local_4;
}

Assistant:

typename SoPlexBase<R>::RangeType SoPlexBase<R>::_switchRangeType(const typename
      SoPlexBase<R>::RangeType&
      rangeType) const
{
   if(rangeType == RANGETYPE_LOWER)
      return RANGETYPE_UPPER;
   else if(rangeType == RANGETYPE_UPPER)
      return RANGETYPE_LOWER;
   else
      return rangeType;
}